

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_hasIndex(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  long lVar1;
  bool b;
  int32_t iVar2;
  long lVar3;
  bool local_171;
  bool local_149;
  Value local_110;
  undefined1 local_100 [8];
  ValueDict map;
  Value local_d8;
  long local_c8;
  long i_1;
  String str;
  Value local_98;
  long local_88;
  long i;
  ValueList list;
  undefined1 local_60 [8];
  Value index;
  ValueType local_30;
  Value self;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  self.data = (anon_union_8_3_2f476f46_for_data)partialResult;
  String::String((String *)&stack0xffffffffffffffc0,"self");
  Context::GetVar((Context *)&stack0xffffffffffffffd0,(String *)context,
                  (LocalOnlyMode)(String *)&stack0xffffffffffffffc0);
  String::~String((String *)&stack0xffffffffffffffc0);
  String::String((String *)&list.isTemp,"index");
  Context::GetVar((Context *)local_60,(String *)context,(char)&list + 8);
  String::~String((String *)&list.isTemp);
  if (local_30 == List) {
    if (local_60[0] == Number) {
      Value::GetList((Value *)&i);
      iVar2 = Value::IntValue((Value *)local_60);
      local_88 = (long)iVar2;
      lVar3 = List<MiniScript::Value>::Count((List<MiniScript::Value> *)&i);
      lVar1 = local_88;
      local_149 = false;
      if (-lVar3 <= (long)iVar2) {
        lVar3 = List<MiniScript::Value>::Count((List<MiniScript::Value> *)&i);
        local_149 = lVar1 < lVar3;
      }
      Value::Truth(&local_98,local_149);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_98,true);
      Value::~Value(&local_98);
      List<MiniScript::Value>::~List((List<MiniScript::Value> *)&i);
    }
    else {
      Value::Value((Value *)&str.isTemp,(Value *)Value::zero);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,(Value *)&str.isTemp,true);
      Value::~Value((Value *)&str.isTemp);
    }
  }
  else if (local_30 == String) {
    if (local_60[0] == Number) {
      Value::GetString((Value *)&i_1);
      iVar2 = Value::IntValue((Value *)local_60);
      local_c8 = (long)iVar2;
      lVar3 = String::Length((String *)&i_1);
      lVar1 = local_c8;
      local_171 = false;
      if (-lVar3 <= (long)iVar2) {
        lVar3 = String::Length((String *)&i_1);
        local_171 = lVar1 < lVar3;
      }
      Value::Truth(&local_d8,local_171);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_d8,true);
      Value::~Value(&local_d8);
      String::~String((String *)&i_1);
    }
    else {
      Value::Value((Value *)&map.isTemp,(Value *)Value::zero);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,(Value *)&map.isTemp,true);
      Value::~Value((Value *)&map.isTemp);
    }
  }
  else if (local_30 == Map) {
    Value::GetDict((ValueDict *)local_100,(Value *)&stack0xffffffffffffffd0);
    b = Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::ContainsKey
                  ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                   local_100,(Value *)local_60);
    Value::Truth(&local_110,b);
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,&local_110,true);
    Value::~Value(&local_110);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)local_100
              );
  }
  else {
    IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)this,(IntrinsicResult *)&IntrinsicResult::Null);
  }
  Value::~Value((Value *)local_60);
  Value::~Value((Value *)&stack0xffffffffffffffd0);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_hasIndex(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value index = context->GetVar("index");
		if (self.type == ValueType::List) {
			if (index.type == ValueType::Number) {
				ValueList list = self.GetList();
				long i = index.IntValue();
				return IntrinsicResult(Value::Truth(i >= -list.Count() and i < list.Count()));
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::String) {
			if (index.type == ValueType::Number) {
				String str = self.GetString();
				long i = index.IntValue();
				return IntrinsicResult(Value::Truth(i >= -str.Length() and i < str.Length()));
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::Map) {
			ValueDict map = self.GetDict();
			return IntrinsicResult(Value::Truth(map.ContainsKey(index)));
		}
		return IntrinsicResult::Null;
	}